

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pager_unlock(Pager *pPager)

{
  sqlite3_io_methods *psVar1;
  sqlite3_file *psVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = (Bitvec *)0x0;
  releaseAllSavepoints(pPager);
  if (pPager->pWal == (Wal *)0x0) {
    if (pPager->exclusiveMode != '\0') goto LAB_00223cc1;
    psVar1 = pPager->fd->pMethods;
    if (psVar1 == (sqlite3_io_methods *)0x0) {
LAB_00223d3f:
      psVar2 = pPager->jfd;
      if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar2->pMethods->xClose)(psVar2);
        psVar2->pMethods = (sqlite3_io_methods *)0x0;
      }
    }
    else {
      uVar3 = (*psVar1->xDeviceCharacteristics)(pPager->fd);
      if (((uVar3 >> 0xb & 1) == 0) || ((pPager->journalMode & 5) != 1)) goto LAB_00223d3f;
    }
    iVar4 = pagerUnlockDb(pPager,0);
    if ((iVar4 != 0) && (pPager->eState == '\x06')) {
      pPager->eLock = '\x05';
    }
    pPager->changeCountDone = '\0';
  }
  else {
    sqlite3WalEndReadTransaction(pPager->pWal);
  }
  pPager->eState = '\0';
LAB_00223cc1:
  if (pPager->errCode != 0) {
    if (pPager->tempFile == '\0') {
      pager_reset(pPager);
      pPager->changeCountDone = '\0';
      bVar5 = false;
    }
    else {
      bVar5 = pPager->jfd->pMethods == (sqlite3_io_methods *)0x0;
    }
    pPager->eState = bVar5;
    if (pPager->bUseFetch != '\0') {
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,0,(void *)0x0);
    }
    pPager->errCode = 0;
    setGetterMethod(pPager);
  }
  pPager->setMaster = '\0';
  pPager->journalOff = 0;
  pPager->journalHdr = 0;
  return;
}

Assistant:

static void pager_unlock(Pager *pPager){

  assert( pPager->eState==PAGER_READER 
       || pPager->eState==PAGER_OPEN 
       || pPager->eState==PAGER_ERROR 
  );

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  releaseAllSavepoints(pPager);

  if( pagerUseWal(pPager) ){
    assert( !isOpen(pPager->jfd) );
    sqlite3WalEndReadTransaction(pPager->pWal);
    pPager->eState = PAGER_OPEN;
  }else if( !pPager->exclusiveMode ){
    int rc;                       /* Error code returned by pagerUnlockDb() */
    int iDc = isOpen(pPager->fd)?sqlite3OsDeviceCharacteristics(pPager->fd):0;

    /* If the operating system support deletion of open files, then
    ** close the journal file when dropping the database lock.  Otherwise
    ** another connection with journal_mode=delete might delete the file
    ** out from under us.
    */
    assert( (PAGER_JOURNALMODE_MEMORY   & 5)!=1 );
    assert( (PAGER_JOURNALMODE_OFF      & 5)!=1 );
    assert( (PAGER_JOURNALMODE_WAL      & 5)!=1 );
    assert( (PAGER_JOURNALMODE_DELETE   & 5)!=1 );
    assert( (PAGER_JOURNALMODE_TRUNCATE & 5)==1 );
    assert( (PAGER_JOURNALMODE_PERSIST  & 5)==1 );
    if( 0==(iDc & SQLITE_IOCAP_UNDELETABLE_WHEN_OPEN)
     || 1!=(pPager->journalMode & 5)
    ){
      sqlite3OsClose(pPager->jfd);
    }

    /* If the pager is in the ERROR state and the call to unlock the database
    ** file fails, set the current lock to UNKNOWN_LOCK. See the comment
    ** above the #define for UNKNOWN_LOCK for an explanation of why this
    ** is necessary.
    */
    rc = pagerUnlockDb(pPager, NO_LOCK);
    if( rc!=SQLITE_OK && pPager->eState==PAGER_ERROR ){
      pPager->eLock = UNKNOWN_LOCK;
    }

    /* The pager state may be changed from PAGER_ERROR to PAGER_OPEN here
    ** without clearing the error code. This is intentional - the error
    ** code is cleared and the cache reset in the block below.
    */
    assert( pPager->errCode || pPager->eState!=PAGER_ERROR );
    pPager->changeCountDone = 0;
    pPager->eState = PAGER_OPEN;
  }

  /* If Pager.errCode is set, the contents of the pager cache cannot be
  ** trusted. Now that there are no outstanding references to the pager,
  ** it can safely move back to PAGER_OPEN state. This happens in both
  ** normal and exclusive-locking mode.
  */
  assert( pPager->errCode==SQLITE_OK || !MEMDB );
  if( pPager->errCode ){
    if( pPager->tempFile==0 ){
      pager_reset(pPager);
      pPager->changeCountDone = 0;
      pPager->eState = PAGER_OPEN;
    }else{
      pPager->eState = (isOpen(pPager->jfd) ? PAGER_OPEN : PAGER_READER);
    }
    if( USEFETCH(pPager) ) sqlite3OsUnfetch(pPager->fd, 0, 0);
    pPager->errCode = SQLITE_OK;
    setGetterMethod(pPager);
  }

  pPager->journalOff = 0;
  pPager->journalHdr = 0;
  pPager->setMaster = 0;
}